

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_standard_logger__on_delete(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  _func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *p_Var1;
  
  if (logger_[1].vtable.on_fctx_start != (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0) {
    p_Var1 = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    do {
      free(*(void **)(logger_[1].vtable.on_test_suite_start + (long)p_Var1 * 8));
      p_Var1 = p_Var1 + 1;
    } while (p_Var1 != logger_[1].vtable.on_fctx_start);
  }
  logger_[1].vtable.on_fctx_start = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
  free(logger_[1].vtable.on_test_suite_start);
  free(logger_);
  return;
}

Assistant:

static void
fct_standard_logger__on_delete(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_standard_logger_t *logger = (fct_standard_logger_t*)logger_;
    fct_unused(e);
    fct_nlist__final(&(logger->failed_cndtns_list), free);
    free(logger);
    logger_ =NULL;
}